

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1cc25c::BuildEngineImpl::demandRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  value_type pTVar1;
  unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
  *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  StateKind SVar4;
  Rule *pRVar5;
  __buckets_ptr pp_Var6;
  _Hash_node_base *p_Var7;
  BuildEngineTrace *this_01;
  pointer pKVar8;
  pointer puVar9;
  int iVar10;
  long lVar11;
  undefined4 extraout_var;
  __node_ptr p_Var13;
  __node_ptr p_Var14;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var15;
  __node_ptr __bkt;
  size_type __n;
  ulong uVar16;
  bool bVar17;
  __node_ptr __n_00;
  _Hash_node_base _Var18;
  __node_ptr p_Var19;
  __node_ptr this_02;
  ulong uVar20;
  __node_ptr p_Var21;
  undefined1 auVar22 [16];
  __buckets_alloc_type __alloc;
  TaskInfo *taskInfo;
  new_allocator<std::__detail::_Hash_node_base_*> local_51;
  long *local_50;
  value_type local_48;
  __node_ptr local_40;
  pthread_mutex_t *local_38;
  long *plVar12;
  
  SVar4 = ruleInfo->state;
  bVar17 = 1 < (int)SVar4;
  if (SVar4 == Complete) {
    bVar17 = (ruleInfo->result).builtAt == this->currentEpoch;
  }
  if (!bVar17) {
    __assert_fail("ruleInfo.isScanned(this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x20c,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
  }
  bVar17 = true;
  if ((SVar4 != Complete) || ((ruleInfo->result).builtAt != this->currentEpoch)) {
    if ((SVar4 & ~IsScanning) != InProgressWaiting) {
      if (SVar4 != NeedsToRun) {
        if (SVar4 == DoesNotNeedToRun) {
          ruleInfo->state = Complete;
          (ruleInfo->result).builtAt = this->currentEpoch;
          lVar11 = std::chrono::_V2::steady_clock::now();
          (ruleInfo->result).end = (double)lVar11 / 1000000000.0;
          pRVar5 = (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
          (*pRVar5->_vptr_Rule[4])(pRVar5,this->buildEngine,1);
          return true;
        }
        __assert_fail("ruleInfo.state == RuleInfo::StateKind::NeedsToRun",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x222,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      pRVar5 = (ruleInfo->rule)._M_t.
               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      iVar10 = (*pRVar5->_vptr_Rule[2])(pRVar5,this->buildEngine);
      plVar12 = (long *)CONCAT44(extraout_var,iVar10);
      if (plVar12 == (long *)0x0) {
        __assert_fail("task && \"rule action returned null task\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x226,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      local_38 = (pthread_mutex_t *)&this->taskInfosMutex;
      iVar10 = pthread_mutex_lock(local_38);
      if (iVar10 != 0) {
        std::__throw_system_error(iVar10);
      }
      this_00 = &this->taskInfos;
      p_Var13 = (__node_ptr)operator_new(0x88);
      (p_Var13->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      *(long **)&(p_Var13->
                 super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                 ._M_storage._M_storage = plVar12;
      *(long **)((long)&(p_Var13->
                        super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                        ._M_storage._M_storage + 8) = plVar12;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x58) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x60) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x70) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x78) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x10) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x20) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x30) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x38) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x3c) = 0;
      *(undefined8 *)
       ((long)&(p_Var13->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x44) = 0;
      p_Var19 = (__node_ptr)(this->taskInfos)._M_h._M_bucket_count;
      __bkt = (__node_ptr)((ulong)plVar12 % (ulong)p_Var19);
      __n_00 = __bkt;
      local_50 = plVar12;
      p_Var14 = std::
                _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_node(&this_00->_M_h,(size_type)__bkt,
                               (key_type *)
                               &p_Var13->
                                super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                               ,(__hash_code)
                                &p_Var13->
                                 super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                              );
      this_02 = p_Var13;
      p_Var21 = p_Var14;
      if (p_Var14 == (__node_ptr)0x0) {
        local_40 = p_Var14;
        auVar22 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&(this->taskInfos)._M_h._M_rehash_policy,(ulong)p_Var19,
                             (this->taskInfos)._M_h._M_element_count);
        __n = auVar22._8_8_;
        if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__n == 1) {
            __s = &(this->taskInfos)._M_h._M_single_bucket;
            (this->taskInfos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          }
          else {
            __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                            (&local_51,__n,(void *)0x0);
            memset(__s,0,__n * 8);
          }
          p_Var19 = (__node_ptr)(this->taskInfos)._M_h._M_before_begin._M_nxt;
          (this->taskInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          if (p_Var19 != (__node_ptr)0x0) {
            p_Var2 = &(this->taskInfos)._M_h._M_before_begin;
            _Var18._M_nxt = (_Hash_node_base *)p_Var19;
            uVar20 = 0;
            do {
              p_Var19 = (__node_ptr)(_Var18._M_nxt)->_M_nxt;
              uVar16 = (ulong)_Var18._M_nxt[1]._M_nxt % __n;
              if (__s[uVar16] == (_Hash_node_base *)0x0) {
                (_Var18._M_nxt)->_M_nxt = p_Var2->_M_nxt;
                p_Var2->_M_nxt = _Var18._M_nxt;
                __s[uVar16] = p_Var2;
                if ((_Var18._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                  pp_Var15 = __s + uVar20;
                  goto LAB_00159b44;
                }
              }
              else {
                (_Var18._M_nxt)->_M_nxt = __s[uVar16]->_M_nxt;
                pp_Var15 = &__s[uVar16]->_M_nxt;
                uVar16 = uVar20;
LAB_00159b44:
                *pp_Var15 = _Var18._M_nxt;
              }
              _Var18._M_nxt = (_Hash_node_base *)p_Var19;
              uVar20 = uVar16;
            } while (p_Var19 != (__node_ptr)0x0);
          }
          pp_Var6 = (this->taskInfos)._M_h._M_buckets;
          if (&(this->taskInfos)._M_h._M_single_bucket != pp_Var6) {
            p_Var19 = (__node_ptr)((this->taskInfos)._M_h._M_bucket_count << 3);
            operator_delete(pp_Var6,(ulong)p_Var19);
          }
          (this->taskInfos)._M_h._M_bucket_count = __n;
          (this->taskInfos)._M_h._M_buckets = __s;
          __bkt = (__node_ptr)((ulong)local_50 % __n);
        }
        pp_Var6 = (this_00->_M_h)._M_buckets;
        if (pp_Var6[(long)__bkt] == (__node_base_ptr)0x0) {
          p_Var19 = (__node_ptr)&(this->taskInfos)._M_h._M_before_begin;
          p_Var7 = (this->taskInfos)._M_h._M_before_begin._M_nxt;
          (p_Var13->super__Hash_node_base)._M_nxt = p_Var7;
          (this->taskInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var13;
          if (p_Var7 != (_Hash_node_base *)0x0) {
            pp_Var6[(ulong)p_Var7[1]._M_nxt % (this->taskInfos)._M_h._M_bucket_count] =
                 (__node_base_ptr)p_Var13;
          }
          (this_00->_M_h)._M_buckets[(long)__bkt] = (__node_base_ptr)p_Var19;
        }
        else {
          (p_Var13->super__Hash_node_base)._M_nxt = pp_Var6[(long)__bkt]->_M_nxt;
          pp_Var6[(long)__bkt]->_M_nxt = (_Hash_node_base *)p_Var13;
        }
        psVar3 = &(this->taskInfos)._M_h._M_element_count;
        *psVar3 = *psVar3 + 1;
        p_Var14 = local_40;
        __n_00 = p_Var19;
        this_02 = (__node_ptr)0x0;
        p_Var21 = p_Var13;
      }
      plVar12 = local_50;
      if (this_02 != (__node_ptr)0x0) {
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
        ::_M_deallocate_node
                  ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
                    *)this_02,__n_00);
      }
      if (p_Var14 != (__node_ptr)0x0) {
        __assert_fail("result.second && \"task already registered\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x22b,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      pTVar1 = (value_type)
               ((p_Var21->
                super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                ).
                super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                ._M_storage._M_storage.__data + 8);
      local_48 = pTVar1;
      pthread_mutex_unlock(local_38);
      *(RuleInfo **)
       ((long)&(p_Var21->
               super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
               ._M_storage._M_storage + 0x40) = ruleInfo;
      this_01 = (this->trace)._M_t.
                super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                ._M_t.
                super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
      if (this_01 != (BuildEngineTrace *)0x0) {
        llbuild::core::BuildEngineTrace::createdTaskForRule
                  (this_01,(Task *)(((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                                      *)&pTVar1->task)->
                                   super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                   (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
      }
      ruleInfo->state = InProgressWaiting;
      (ruleInfo->inProgressInfo).pendingScanRecord = (RuleScanRecord *)pTVar1;
      pKVar8 = (ruleInfo->result).dependencies.keys.
               super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ruleInfo->result).dependencies.keys.
          super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
          super__Vector_impl_data._M_finish != pKVar8) {
        (ruleInfo->result).dependencies.keys.
        super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
        super__Vector_impl_data._M_finish = pKVar8;
      }
      puVar9 = (ruleInfo->result).dependencies.flags.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ruleInfo->result).dependencies.flags.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar9) {
        (ruleInfo->result).dependencies.flags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar9;
      }
      (**(code **)(*plVar12 + 0x10))(plVar12,this,plVar12);
      if (((ruleInfo->result).builtAt != 0) &&
         ((((ruleInfo->rule)._M_t.
            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
            _M_t.
            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->signature).value ==
          (ruleInfo->result).signature.value)) {
        (**(code **)(*plVar12 + 0x18))(plVar12,this,plVar12,&ruleInfo->result);
      }
      if (local_48->waitCount == 0) {
        std::
        deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ::push_back(&this->readyTaskInfos,&local_48);
      }
    }
    bVar17 = false;
  }
  return bVar17;
}

Assistant:

bool isScanned(const BuildEngineImpl* engine) const {
      // If the rule is marked as complete, just check that state.
      if (state == StateKind::Complete)
        return isComplete(engine);

      // Otherwise, the rule is scanned if it has passed the scanning state.
      return int(state) > int(StateKind::IsScanning);
    }